

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

_Bool wildcard_iterate(char *filename,_func__Bool_void_ptr_char_ptr *func,void *ctx)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  SftpWildcardMatcher *swcm;
  bool bVar6;
  
  sVar3 = strlen(filename);
  pcVar4 = (char *)safemalloc(sVar3 + 1,1,0);
  _Var1 = wc_unescape(pcVar4,filename);
  if (_Var1) {
    pcVar5 = canonify(pcVar4);
    _Var1 = (*func)(ctx,pcVar5);
    safefree(pcVar5);
    safefree(pcVar4);
  }
  else {
    swcm = sftp_begin_wildcard_matching(filename);
    safefree(pcVar4);
    if (swcm == (SftpWildcardMatcher *)0x0) {
      _Var1 = false;
    }
    else {
      _Var1 = true;
      bVar6 = false;
      while (pcVar4 = sftp_wildcard_get_filename(swcm), pcVar4 != (char *)0x0) {
        pcVar5 = canonify(pcVar4);
        safefree(pcVar4);
        _Var2 = (*func)(ctx,pcVar5);
        _Var1 = (_Bool)(_Var1 & _Var2);
        safefree(pcVar5);
        bVar6 = true;
      }
      if (!bVar6) {
        printf("%s: nothing matched\n",filename);
      }
      sftp_finish_wildcard_matching(swcm);
    }
  }
  return _Var1;
}

Assistant:

bool wildcard_iterate(char *filename, bool (*func)(void *, char *), void *ctx)
{
    char *unwcfname, *newname, *cname;
    bool is_wc, toret;

    unwcfname = snewn(strlen(filename)+1, char);
    is_wc = !wc_unescape(unwcfname, filename);

    if (is_wc) {
        SftpWildcardMatcher *swcm = sftp_begin_wildcard_matching(filename);
        bool matched = false;
        sfree(unwcfname);

        if (!swcm)
            return false;

        toret = true;

        while ( (newname = sftp_wildcard_get_filename(swcm)) != NULL ) {
            cname = canonify(newname);
            sfree(newname);
            matched = true;
            if (!func(ctx, cname))
                toret = false;
            sfree(cname);
        }

        if (!matched) {
            /* Politely warn the user that nothing matched. */
            printf("%s: nothing matched\n", filename);
        }

        sftp_finish_wildcard_matching(swcm);
    } else {
        cname = canonify(unwcfname);
        toret = func(ctx, cname);
        sfree(cname);
        sfree(unwcfname);
    }

    return toret;
}